

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int received_get_section_number(RECEIVED_HANDLE received,uint32_t *section_number_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  RECEIVED_INSTANCE *received_instance;
  uint32_t item_count;
  int result;
  uint32_t *section_number_value_local;
  RECEIVED_HANDLE received_local;
  
  if (received == (RECEIVED_HANDLE)0x0) {
    received_instance._4_4_ = 0x43cd;
  }
  else {
    _item_count = section_number_value;
    section_number_value_local = (uint32_t *)received;
    iVar1 = amqpvalue_get_composite_item_count
                      (received->composite_value,(uint32_t *)&received_instance);
    if (iVar1 == 0) {
      if ((int)received_instance == 0) {
        received_instance._4_4_ = 0x43db;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(received->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          received_instance._4_4_ = 0x43e3;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            received_instance._4_4_ = 0;
          }
          else {
            received_instance._4_4_ = 0x43ea;
          }
        }
      }
    }
    else {
      received_instance._4_4_ = 0x43d5;
    }
  }
  return received_instance._4_4_;
}

Assistant:

int received_get_section_number(RECEIVED_HANDLE received, uint32_t* section_number_value)
{
    int result;

    if (received == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)received;
        if (amqpvalue_get_composite_item_count(received_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(received_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_uint(item_value, section_number_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}